

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

word Abc_Isop14Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  int iVar1;
  int iVar2;
  word Cost;
  word Cost_00;
  word wVar3;
  int *local_14c8;
  int *local_1490;
  int nWords;
  int nVars;
  int c;
  word Cost2;
  word Cost1;
  word Cost0;
  word uRes2 [128];
  word uRes1 [128];
  word uRes0 [128];
  word uOnDc2 [128];
  word uOn2 [128];
  int *pCover_local;
  word CostLim_local;
  word *pRes_local;
  word *pOnDc_local;
  word *pOn_local;
  
  for (nWords = 0; nWords < 0x80; nWords = nWords + 1) {
    uOnDc2[(long)nWords + 0x7f] = pOn[nWords] & (pOnDc[nWords + 0x80] ^ 0xffffffffffffffff);
  }
  Cost = Abc_IsopCheck(uOnDc2 + 0x7f,pOnDc,uRes1 + 0x7f,0xd,CostLim,pCover);
  pOn_local = (word *)CostLim;
  if (Cost < CostLim) {
    for (nWords = 0; nWords < 0x80; nWords = nWords + 1) {
      uOnDc2[(long)nWords + 0x7f] = pOn[nWords + 0x80] & (pOnDc[nWords] ^ 0xffffffffffffffff);
    }
    if (pCover == (int *)0x0) {
      local_1490 = (int *)0x0;
    }
    else {
      iVar1 = Abc_CostCubes(Cost);
      local_1490 = pCover + iVar1;
    }
    Cost_00 = Abc_IsopCheck(uOnDc2 + 0x7f,pOnDc + 0x80,uRes2 + 0x7f,0xd,CostLim,local_1490);
    if (Cost + Cost_00 < CostLim) {
      for (nWords = 0; nWords < 0x80; nWords = nWords + 1) {
        uOnDc2[(long)nWords + 0x7f] =
             pOn[nWords] & (uRes1[(long)nWords + 0x7f] ^ 0xffffffffffffffff) |
             pOn[nWords + 0x80] & (uRes2[(long)nWords + 0x7f] ^ 0xffffffffffffffff);
        uRes0[(long)nWords + 0x7f] = pOnDc[nWords] & pOnDc[nWords + 0x80];
      }
      if (pCover == (int *)0x0) {
        local_14c8 = (int *)0x0;
      }
      else {
        iVar1 = Abc_CostCubes(Cost);
        iVar2 = Abc_CostCubes(Cost_00);
        local_14c8 = pCover + (long)iVar1 + (long)iVar2;
      }
      wVar3 = Abc_IsopCheck(uOnDc2 + 0x7f,uRes0 + 0x7f,&Cost0,0xd,CostLim,local_14c8);
      if (Cost + Cost_00 + wVar3 < CostLim) {
        for (nWords = 0; nWords < 0x80; nWords = nWords + 1) {
          pRes[nWords] = uRes2[(long)nWords + -1] | uRes1[(long)nWords + 0x7f];
          pRes[nWords + 0x80] = uRes2[(long)nWords + -1] | uRes2[(long)nWords + 0x7f];
        }
        for (nWords = 0; nWords < 0x100; nWords = nWords + 1) {
          if (((pOn[nWords] & (pRes[nWords] ^ 0xffffffffffffffff)) != 0) ||
             ((pRes[nWords] & (pOnDc[nWords] ^ 0xffffffffffffffff)) != 0)) {
            __assert_fail("(pOn[c] & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                          ,0x170,"word Abc_Isop14Cover(word *, word *, word *, word, int *)");
          }
        }
        Abc_IsopAddLits(pCover,Cost,Cost_00,0xd);
        iVar1 = Abc_CostCubes(Cost);
        iVar2 = Abc_CostCubes(Cost_00);
        pOn_local = (word *)(Cost + Cost_00 + wVar3 + (long)iVar1 + (long)iVar2);
      }
    }
  }
  return (word)pOn_local;
}

Assistant:

word Abc_Isop14Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn2[128], uOnDc2[128], uRes0[128], uRes1[128], uRes2[128];
    word Cost0, Cost1, Cost2; int c, nVars = 13, nWords = 128;
    // negative cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c] & ~pOnDc[c+nWords];
    Cost0 = Abc_IsopCheck( uOn2, pOnDc,        uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    // positive cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c+nWords] & ~pOnDc[c];
    Cost1 = Abc_IsopCheck( uOn2, pOnDc+nWords, uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    // middle cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = (pOn[c] & ~uRes0[c]) | (pOn[c+nWords] & ~uRes1[c]), uOnDc2[c] = pOnDc[c] & pOnDc[c+nWords];
    Cost2 = Abc_IsopCheck( uOn2, uOnDc2,       uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    for ( c = 0; c < nWords; c++ )
        pRes[c] = uRes2[c] | uRes0[c], pRes[c+nWords] = uRes2[c] | uRes1[c];
    // verify
    for ( c = 0; c < (nWords<<1); c++ )
        assert( (pOn[c]  & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}